

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall
glslang::HlslGrammar::acceptCompoundStatement(HlslGrammar *this,TIntermNode **retStatement)

{
  TIntermNode *right;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermAggregate *pTVar3;
  TIntermAggregate *statements;
  TIntermNode *statement;
  TIntermNode *local_40;
  TIntermNode **local_38;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (!bVar1) {
    return false;
  }
  local_40 = (TIntermNode *)0x0;
  local_38 = retStatement;
  bVar1 = acceptStatement(this,&local_40);
  if (bVar1) {
    pTVar3 = (TIntermAggregate *)0x0;
    statements = (TIntermAggregate *)0x0;
    do {
      while (right = local_40, local_40 == (TIntermNode *)0x0) {
LAB_0042cece:
        statements = TIntermediate::growAggregate
                               (this->intermediate,(TIntermNode *)statements,right);
        bVar1 = acceptStatement(this,&local_40);
        if (!bVar1) {
          if (statements == (TIntermAggregate *)0x0) goto LAB_0042cf2a;
          (*(statements->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x31])(statements,(ulong)(this->intermediate->debugInfo + 1));
          pTVar3 = statements;
          goto LAB_0042cf2c;
        }
      }
      iVar2 = (*local_40->_vptr_TIntermNode[0xd])(local_40);
      if ((CONCAT44(extraout_var,iVar2) == 0) ||
         (1 < *(int *)(CONCAT44(extraout_var,iVar2) + 0x20) - 0x16dU)) goto LAB_0042cece;
      HlslParseContext::wrapupSwitchSubsequence(this->parseContext,statements,right);
      bVar1 = acceptStatement(this,&local_40);
      statements = (TIntermAggregate *)0x0;
    } while (bVar1);
  }
  else {
LAB_0042cf2a:
    pTVar3 = (TIntermAggregate *)0x0;
  }
LAB_0042cf2c:
  *local_38 = (TIntermNode *)pTVar3;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptCompoundStatement(TIntermNode*& retStatement)
{
    TIntermAggregate* compoundStatement = nullptr;

    // LEFT_CURLY
    if (! acceptTokenClass(EHTokLeftBrace))
        return false;

    // statement statement ...
    TIntermNode* statement = nullptr;
    while (acceptStatement(statement)) {
        TIntermBranch* branch = statement ? statement->getAsBranchNode() : nullptr;
        if (branch != nullptr && (branch->getFlowOp() == EOpCase ||
                                  branch->getFlowOp() == EOpDefault)) {
            // hook up individual subsequences within a switch statement
            parseContext.wrapupSwitchSubsequence(compoundStatement, statement);
            compoundStatement = nullptr;
        } else {
            // hook it up to the growing compound statement
            compoundStatement = intermediate.growAggregate(compoundStatement, statement);
        }
    }
    if (compoundStatement)
        compoundStatement->setOperator(intermediate.getDebugInfo() ? EOpScope : EOpSequence);

    retStatement = compoundStatement;

    // RIGHT_CURLY
    return acceptTokenClass(EHTokRightBrace);
}